

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O1

int av1_get_pred_context_uni_comp_ref_p2(MACROBLOCKD *xd)

{
  int iVar1;
  
  iVar1 = 1;
  if (xd->neighbors_ref_counts[3] != xd->neighbors_ref_counts[4]) {
    iVar1 = (uint)(xd->neighbors_ref_counts[4] <= xd->neighbors_ref_counts[3]) * 2;
  }
  return iVar1;
}

Assistant:

int av1_get_pred_context_uni_comp_ref_p2(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of LAST3
  const int last3_count = ref_counts[LAST3_FRAME];
  // Count of GOLDEN
  const int gld_count = ref_counts[GOLDEN_FRAME];

  const int pred_context =
      (last3_count == gld_count) ? 1 : ((last3_count < gld_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < UNI_COMP_REF_CONTEXTS);
  return pred_context;
}